

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_BooleanReturnValueSetsDifferentValues_TestShell::
TEST_MockReturnValueTest_BooleanReturnValueSetsDifferentValues_TestShell
          (TEST_MockReturnValueTest_BooleanReturnValueSetsDifferentValues_TestShell *this)

{
  TEST_MockReturnValueTest_BooleanReturnValueSetsDifferentValues_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_MockReturnValueTest_BooleanReturnValueSetsDifferentValues_TestShell_00346b80;
  return;
}

Assistant:

TEST(MockReturnValueTest, BooleanReturnValueSetsDifferentValues)
{
    bool expected_value = true;
    bool another_expected_value = false;

    mock().expectOneCall("foo").andReturnValue(expected_value);
    mock().expectOneCall("foo").andReturnValue(another_expected_value);

    CHECK_EQUAL(expected_value, mock().actualCall("foo").returnValue().getBoolValue());
    CHECK_EQUAL(expected_value, mock().returnValue().getBoolValue());
    CHECK_EQUAL(another_expected_value, mock().actualCall("foo").returnValue().getBoolValue());
    CHECK_EQUAL(another_expected_value, mock().returnValue().getBoolValue());
}